

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::IngestRanges(DBImpl *this,string *oldfname,string *newfname)

{
  Comparator *pCVar1;
  int iVar2;
  Iterator *pIVar3;
  Iterator *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  RandomAccessFile *pRVar5;
  Iterator *pIVar6;
  Table *pTVar7;
  RandomAccessFile *oldfile;
  Table *newtable;
  RandomAccessFile *newfile;
  Table *oldtable;
  WriteBatch batch;
  uint64_t newfile_size;
  uint64_t oldfile_size;
  Options options;
  Slice local_110;
  Slice local_100;
  RandomAccessFile *local_f0;
  Table *local_e8;
  RandomAccessFile *local_e0;
  Table *local_d8;
  WriteBatch local_d0;
  uint64_t local_b0;
  uint64_t local_a8;
  ReadOptions local_a0;
  Options local_90;
  
  pTVar7 = (Table *)0x0;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  Options::Options(&local_90);
  local_90.filter_policy = (FilterPolicy *)0x0;
  local_90.compression = kSnappyCompression;
  local_a0.verify_checksums = false;
  local_a0.fill_cache = true;
  local_a0.snapshot = (Snapshot *)0x0;
  local_f0 = (RandomAccessFile *)0x0;
  local_d8 = (Table *)0x0;
  (**(code **)(*(long *)oldfname->_M_string_length + 0x58))
            (&local_d0,(long *)oldfname->_M_string_length,newfname,&local_a8);
  (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
  if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
    (**(code **)(*(long *)oldfname->_M_string_length + 0x18))
              (&local_d0,(long *)oldfname->_M_string_length,newfname,&local_f0);
    (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
    if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
      Table::Open((Table *)&local_d0,&local_90,local_f0,local_a8,&local_d8);
      (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
      if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
        pIVar3 = Table::NewIterator(local_d8,&local_a0);
        local_e0 = (RandomAccessFile *)0x0;
        local_e8 = (Table *)0x0;
        (**(code **)(*(long *)oldfname->_M_string_length + 0x58))(&local_d0);
        (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
        if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
          (**(code **)(*(long *)oldfname->_M_string_length + 0x18))(&local_d0);
          (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
          if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
            Table::Open((Table *)&local_d0,&local_90,local_e0,local_b0,&local_e8);
            (this->super_DB)._vptr_DB = (_func_int **)local_d0.rep_._M_dataplus._M_p;
            if ((_func_int **)local_d0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
              pIVar4 = Table::NewIterator(local_e8,&local_a0);
              WriteBatch::WriteBatch(&local_d0);
              (*pIVar3->_vptr_Iterator[3])(pIVar3);
              (*pIVar4->_vptr_Iterator[3])(pIVar4);
LAB_0010d2cf:
              do {
                iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
                if ((char)iVar2 == '\0') {
                  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
                  if ((char)iVar2 == '\0') {
                    local_100.data_ = (char *)((ulong)local_100.data_ & 0xffffffffffffff00);
                    (**(code **)((oldfname->_M_dataplus)._M_p + 0x20))
                              (&local_110,oldfname,&local_100,&local_d0);
                    (this->super_DB)._vptr_DB = (_func_int **)local_110.data_;
                    (*pIVar3->_vptr_Iterator[1])(pIVar3);
                    pTVar7 = local_d8;
                    if (local_d8 != (Table *)0x0) {
                      Table::~Table(local_d8);
                    }
                    operator_delete(pTVar7);
                    if (local_f0 != (RandomAccessFile *)0x0) {
                      (*local_f0->_vptr_RandomAccessFile[1])();
                    }
                    (*pIVar4->_vptr_Iterator[1])(pIVar4);
                    pTVar7 = local_e8;
                    if (local_e8 != (Table *)0x0) {
                      Table::~Table(local_e8);
                    }
                    operator_delete(pTVar7);
                    if (local_e0 != (RandomAccessFile *)0x0) {
                      (*local_e0->_vptr_RandomAccessFile[1])();
                    }
                    WriteBatch::~WriteBatch(&local_d0);
                    return (Status)(char *)this;
                  }
                  iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
                  local_110.data_ = (char *)CONCAT44(extraout_var_03,iVar2);
                  iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
                  local_100.data_ = (char *)CONCAT44(extraout_var_04,iVar2);
                  WriteBatch::Put(&local_d0,&local_110,&local_100);
                  pIVar6 = pIVar4;
                }
                else {
                  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
                  pCVar1 = local_90.comparator;
                  if ((char)iVar2 != '\0') {
                    iVar2 = (*pIVar3->_vptr_Iterator[8])(pIVar3);
                    local_110.data_ = (char *)CONCAT44(extraout_var,iVar2);
                    iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
                    local_100.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
                    iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_110,&local_100);
                    pCVar1 = local_90.comparator;
                    if (iVar2 < 0) {
                      iVar2 = (*pIVar3->_vptr_Iterator[8])(pIVar3);
                      local_110.data_ = (char *)CONCAT44(extraout_var_06,iVar2);
                      WriteBatch::Delete(&local_d0,&local_110);
                      pIVar6 = pIVar3;
                    }
                    else {
                      pIVar6 = pIVar4;
                      if (iVar2 == 0) {
                        iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
                        local_110.data_ = (char *)CONCAT44(extraout_var_07,iVar2);
                        iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
                        local_100.data_ = (char *)CONCAT44(extraout_var_08,iVar2);
                        iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_110,&local_100);
                        if (iVar2 != 0) {
                          iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
                          local_110.data_ = (char *)CONCAT44(extraout_var_09,iVar2);
                          iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
                          local_100.data_ = (char *)CONCAT44(extraout_var_10,iVar2);
                          WriteBatch::Put(&local_d0,&local_110,&local_100);
                        }
                        (*pIVar3->_vptr_Iterator[6])(pIVar3);
                      }
                      else {
                        iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
                        local_110.data_ = (char *)CONCAT44(extraout_var_01,iVar2);
                        iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
                        local_100.data_ = (char *)CONCAT44(extraout_var_02,iVar2);
                        WriteBatch::Put(&local_d0,&local_110,&local_100);
                      }
                    }
                    (*pIVar6->_vptr_Iterator[6])();
                    goto LAB_0010d2cf;
                  }
                  iVar2 = (*pIVar3->_vptr_Iterator[8])(pIVar3);
                  local_110.data_ = (char *)CONCAT44(extraout_var_05,iVar2);
                  WriteBatch::Delete(&local_d0,&local_110);
                  pIVar6 = pIVar3;
                }
                (*pIVar6->_vptr_Iterator[6])();
              } while( true );
            }
          }
        }
        pTVar7 = local_d8;
        if (local_d8 != (Table *)0x0) {
          Table::~Table(local_d8);
        }
        operator_delete(pTVar7);
        if (local_f0 != (RandomAccessFile *)0x0) {
          (*local_f0->_vptr_RandomAccessFile[1])();
        }
        pTVar7 = local_e8;
        if (local_e8 != (Table *)0x0) {
          Table::~Table(local_e8);
        }
        operator_delete(pTVar7);
        pRVar5 = local_e0;
        goto LAB_0010d190;
      }
    }
    pTVar7 = local_d8;
    if (local_d8 == (Table *)0x0) {
      pTVar7 = (Table *)0x0;
    }
    else {
      Table::~Table(local_d8);
    }
  }
  operator_delete(pTVar7);
  pRVar5 = local_f0;
LAB_0010d190:
  if (pRVar5 != (RandomAccessFile *)0x0) {
    (*pRVar5->_vptr_RandomAccessFile[1])();
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::IngestRanges(const std::string& oldfname, 
                            const std::string& newfname) {
  Status s;
  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  ReadOptions readoptions;
  readoptions.fill_cache = true;

  // get iterator for old file
  uint64_t oldfile_size;
  RandomAccessFile* oldfile = nullptr;
  Table* oldtable = nullptr;

  s = env_->GetFileSize(oldfname, &oldfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(oldfname, &oldfile);
  }

  if (s.ok()) {
    s = Table::Open(options, oldfile, oldfile_size, &oldtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    return s;
  }

  Iterator* olditer = oldtable->NewIterator(readoptions);

  // get iterator for new file
  uint64_t newfile_size;
  RandomAccessFile* newfile = nullptr;
  Table* newtable = nullptr;

  s = env_->GetFileSize(newfname, &newfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(newfname, &newfile);
  }

  if (s.ok()) {
    s = Table::Open(options, newfile, newfile_size, &newtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    delete newtable;
    delete newfile;
    return s;
  }

  Iterator* newiter = newtable->NewIterator(readoptions);

  // Merge two iter and update db
  WriteBatch batch;

  olditer->SeekToFirst();
  newiter->SeekToFirst();
  while (true)
  {
    if(!olditer->Valid()) {
      if(newiter->Valid()) {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
      else break;
    }
    else if(!newiter->Valid()){
      batch.Delete(olditer->key());
      olditer->Next();
    }
    else {
      int cmp = options.comparator->Compare(olditer->key(), newiter->key());
      if (cmp < 0) {
        batch.Delete(olditer->key());
        olditer->Next();
      }
      else if (cmp == 0) {
        if (options.comparator->Compare(olditer->value(), newiter->value()) != 0) {
          batch.Put(newiter->key(), newiter->value());
        }
        olditer->Next();
        newiter->Next();
      }
      else {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
    }
  }

  s = Write(WriteOptions(), &batch);
  
  delete olditer;
  delete oldtable;
  delete oldfile;
  delete newiter;
  delete newtable;
  delete newfile;

  return s;
}